

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

cmGeneratorTarget * __thiscall
cmLocalGenerator::FindGeneratorTarget(cmLocalGenerator *this,string *name)

{
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  __last;
  const_iterator cVar1;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  _Var2;
  NamedGeneratorTargetFinder NStack_68;
  string local_48 [32];
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->AliasTargets)._M_t,name);
  _Var2._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (this->GeneratorTargets).
       super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if ((_Rb_tree_header *)cVar1._M_node == &(this->AliasTargets)._M_t._M_impl.super__Rb_tree_header)
  {
    std::__cxx11::string::string((string *)&NStack_68,(string *)name);
    _Var2 = std::
            find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                      (_Var2,__last,&NStack_68);
    std::__cxx11::string::~string((string *)&NStack_68);
    if (_Var2._M_current ==
        (this->GeneratorTargets).
        super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (cmGeneratorTarget *)0x0;
    }
  }
  else {
    std::__cxx11::string::string(local_48,(string *)(cVar1._M_node + 2));
    _Var2 = std::
            find_if<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,NamedGeneratorTargetFinder>
                      (_Var2,__last,(NamedGeneratorTargetFinder *)local_48);
    std::__cxx11::string::~string(local_48);
  }
  return *_Var2._M_current;
}

Assistant:

cmGeneratorTarget* cmLocalGenerator::FindGeneratorTarget(
    const std::string& name) const
{
  std::map<std::string, std::string>::const_iterator i =
      this->AliasTargets.find(name);
  if (i != this->AliasTargets.end())
    {
    std::vector<cmGeneratorTarget*>::const_iterator ai =
        std::find_if(this->GeneratorTargets.begin(),
                     this->GeneratorTargets.end(),
                     NamedGeneratorTargetFinder(i->second));
    return *ai;
    }
  std::vector<cmGeneratorTarget*>::const_iterator ti =
      std::find_if(this->GeneratorTargets.begin(),
                   this->GeneratorTargets.end(),
                   NamedGeneratorTargetFinder(name));
  if ( ti != this->GeneratorTargets.end() )
    {
    return *ti;
    }

  return 0;
}